

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlEntityPtr xmlParseStringEntityRef(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  xmlChar *pxVar1;
  xmlParserCtxtPtr local_40;
  xmlEntityPtr ent;
  xmlChar *pxStack_30;
  xmlChar cur;
  xmlChar *ptr;
  xmlChar *name;
  xmlChar **str_local;
  xmlParserCtxtPtr ctxt_local;
  
  local_40 = (xmlParserCtxtPtr)0x0;
  if ((str == (xmlChar **)0x0) || (*str == (xmlChar *)0x0)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else if (**str == '&') {
    pxStack_30 = *str + 1;
    name = (xmlChar *)str;
    str_local = (xmlChar **)ctxt;
    ptr = xmlParseStringName(ctxt,&stack0xffffffffffffffd0);
    if (ptr == (xmlChar *)0x0) {
      xmlFatalErrMsg((xmlParserCtxtPtr)str_local,XML_ERR_NAME_REQUIRED,
                     "xmlParseStringEntityRef: no name\n");
      *(xmlChar **)name = pxStack_30;
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else if (*pxStack_30 == ';') {
      pxStack_30 = pxStack_30 + 1;
      if (((*(uint *)((long)str_local + 0x234) & 0x100000) == 0) &&
         (local_40 = (xmlParserCtxtPtr)xmlGetPredefinedEntity(ptr),
         local_40 != (xmlParserCtxtPtr)0x0)) {
        (*xmlFree)(ptr);
        *(xmlChar **)name = pxStack_30;
        ctxt_local = local_40;
      }
      else {
        str_local[0x57] = str_local[0x57] + 1;
        if (*str_local != (xmlChar *)0x0) {
          if (*(long *)(*str_local + 0x28) != 0) {
            local_40 = (xmlParserCtxtPtr)(**(code **)(*str_local + 0x28))(str_local[1],ptr);
          }
          if ((local_40 == (xmlParserCtxtPtr)0x0) &&
             ((*(uint *)((long)str_local + 0x234) & 0x100000) != 0)) {
            local_40 = (xmlParserCtxtPtr)xmlGetPredefinedEntity(ptr);
          }
          if ((local_40 == (xmlParserCtxtPtr)0x0) && ((xmlChar **)str_local[1] == str_local)) {
            local_40 = (xmlParserCtxtPtr)xmlSAX2GetEntity(str_local,ptr);
          }
        }
        if (*(int *)(str_local + 0x22) == -1) {
          (*xmlFree)(ptr);
          ctxt_local = (xmlParserCtxtPtr)0x0;
        }
        else {
          if (local_40 == (xmlParserCtxtPtr)0x0) {
            if ((*(int *)(str_local + 6) == 1) ||
               ((*(int *)((long)str_local + 0x8c) == 0 && (*(int *)(str_local + 0x12) == 0)))) {
              xmlFatalErrMsgStr((xmlParserCtxtPtr)str_local,XML_ERR_UNDECLARED_ENTITY,
                                "Entity \'%s\' not defined\n",ptr);
            }
            else {
              xmlErrMsgStr((xmlParserCtxtPtr)str_local,XML_WAR_UNDECLARED_ENTITY,
                           "Entity \'%s\' not defined\n",ptr);
            }
            xmlParserEntityCheck((xmlParserCtxtPtr)str_local,0,(xmlEntityPtr)0x0,0);
          }
          else if (local_40->nodeMax == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
            xmlFatalErrMsgStr((xmlParserCtxtPtr)str_local,XML_ERR_UNPARSED_ENTITY,
                              "Entity reference to unparsed entity %s\n",ptr);
          }
          else if ((*(int *)(str_local + 0x22) == 0xc) &&
                  (local_40->nodeMax == XML_EXTERNAL_GENERAL_PARSED_ENTITY)) {
            xmlFatalErrMsgStr((xmlParserCtxtPtr)str_local,XML_ERR_ENTITY_IS_EXTERNAL,
                              "Attribute references external entity \'%s\'\n",ptr);
          }
          else if (((*(int *)(str_local + 0x22) == 0xc) &&
                   (((local_40 != (xmlParserCtxtPtr)0x0 && (local_40->node != (xmlNodePtr)0x0)) &&
                    (local_40->nodeMax != XML_INTERNAL_PREDEFINED_ENTITY)))) &&
                  (pxVar1 = xmlStrchr((xmlChar *)local_40->node,'<'), pxVar1 != (xmlChar *)0x0)) {
            xmlFatalErrMsgStr((xmlParserCtxtPtr)str_local,XML_ERR_LT_IN_ATTRIBUTE,
                              "\'<\' in entity \'%s\' is not allowed in attributes values\n",ptr);
          }
          else if (local_40->nodeMax == XML_INTERNAL_PARAMETER_ENTITY ||
                   local_40->nodeMax == XML_EXTERNAL_PARAMETER_ENTITY) {
            xmlFatalErrMsgStr((xmlParserCtxtPtr)str_local,XML_ERR_ENTITY_IS_PARAMETER,
                              "Attempt to reference the parameter entity \'%s\'\n",ptr);
          }
          (*xmlFree)(ptr);
          *(xmlChar **)name = pxStack_30;
          ctxt_local = local_40;
        }
      }
    }
    else {
      xmlFatalErr((xmlParserCtxtPtr)str_local,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
      (*xmlFree)(ptr);
      *(xmlChar **)name = pxStack_30;
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
  }
  else {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  return (xmlEntityPtr)ctxt_local;
}

Assistant:

static xmlEntityPtr
xmlParseStringEntityRef(xmlParserCtxtPtr ctxt, const xmlChar ** str) {
    xmlChar *name;
    const xmlChar *ptr;
    xmlChar cur;
    xmlEntityPtr ent = NULL;

    if ((str == NULL) || (*str == NULL))
        return(NULL);
    ptr = *str;
    cur = *ptr;
    if (cur != '&')
	return(NULL);

    ptr++;
    name = xmlParseStringName(ctxt, &ptr);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
		       "xmlParseStringEntityRef: no name\n");
	*str = ptr;
	return(NULL);
    }
    if (*ptr != ';') {
	xmlFatalErr(ctxt, XML_ERR_ENTITYREF_SEMICOL_MISSING, NULL);
        xmlFree(name);
	*str = ptr;
	return(NULL);
    }
    ptr++;


    /*
     * Predefined entities override any extra definition
     */
    if ((ctxt->options & XML_PARSE_OLDSAX) == 0) {
        ent = xmlGetPredefinedEntity(name);
        if (ent != NULL) {
            xmlFree(name);
            *str = ptr;
            return(ent);
        }
    }

    /*
     * Increase the number of entity references parsed
     */
    ctxt->nbentities++;

    /*
     * Ask first SAX for entity resolution, otherwise try the
     * entities which may have stored in the parser context.
     */
    if (ctxt->sax != NULL) {
	if (ctxt->sax->getEntity != NULL)
	    ent = ctxt->sax->getEntity(ctxt->userData, name);
	if ((ent == NULL) && (ctxt->options & XML_PARSE_OLDSAX))
	    ent = xmlGetPredefinedEntity(name);
	if ((ent == NULL) && (ctxt->userData==ctxt)) {
	    ent = xmlSAX2GetEntity(ctxt, name);
	}
    }
    if (ctxt->instate == XML_PARSER_EOF) {
	xmlFree(name);
	return(NULL);
    }

    /*
     * [ WFC: Entity Declared ]
     * In a document without any DTD, a document with only an
     * internal DTD subset which contains no parameter entity
     * references, or a document with "standalone='yes'", the
     * Name given in the entity reference must match that in an
     * entity declaration, except that well-formed documents
     * need not declare any of the following entities: amp, lt,
     * gt, apos, quot.
     * The declaration of a parameter entity must precede any
     * reference to it.
     * Similarly, the declaration of a general entity must
     * precede any reference to it which appears in a default
     * value in an attribute-list declaration. Note that if
     * entities are declared in the external subset or in
     * external parameter entities, a non-validating processor
     * is not obligated to read and process their declarations;
     * for such documents, the rule that an entity must be
     * declared is a well-formedness constraint only if
     * standalone='yes'.
     */
    if (ent == NULL) {
	if ((ctxt->standalone == 1) ||
	    ((ctxt->hasExternalSubset == 0) &&
	     (ctxt->hasPErefs == 0))) {
	    xmlFatalErrMsgStr(ctxt, XML_ERR_UNDECLARED_ENTITY,
		     "Entity '%s' not defined\n", name);
	} else {
	    xmlErrMsgStr(ctxt, XML_WAR_UNDECLARED_ENTITY,
			  "Entity '%s' not defined\n",
			  name);
	}
	xmlParserEntityCheck(ctxt, 0, ent, 0);
	/* TODO ? check regressions ctxt->valid = 0; */
    }

    /*
     * [ WFC: Parsed Entity ]
     * An entity reference must not contain the name of an
     * unparsed entity
     */
    else if (ent->etype == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_UNPARSED_ENTITY,
		 "Entity reference to unparsed entity %s\n", name);
    }

    /*
     * [ WFC: No External Entity References ]
     * Attribute values cannot contain direct or indirect
     * entity references to external entities.
     */
    else if ((ctxt->instate == XML_PARSER_ATTRIBUTE_VALUE) &&
	     (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY)) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_ENTITY_IS_EXTERNAL,
	 "Attribute references external entity '%s'\n", name);
    }
    /*
     * [ WFC: No < in Attribute Values ]
     * The replacement text of any entity referred to directly or
     * indirectly in an attribute value (other than "&lt;") must
     * not contain a <.
     */
    else if ((ctxt->instate == XML_PARSER_ATTRIBUTE_VALUE) &&
	     (ent != NULL) && (ent->content != NULL) &&
	     (ent->etype != XML_INTERNAL_PREDEFINED_ENTITY) &&
	     (xmlStrchr(ent->content, '<'))) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_LT_IN_ATTRIBUTE,
     "'<' in entity '%s' is not allowed in attributes values\n",
			  name);
    }

    /*
     * Internal check, no parameter entities here ...
     */
    else {
	switch (ent->etype) {
	    case XML_INTERNAL_PARAMETER_ENTITY:
	    case XML_EXTERNAL_PARAMETER_ENTITY:
		xmlFatalErrMsgStr(ctxt, XML_ERR_ENTITY_IS_PARAMETER,
	     "Attempt to reference the parameter entity '%s'\n",
				  name);
	    break;
	    default:
	    break;
	}
    }

    /*
     * [ WFC: No Recursion ]
     * A parsed entity must not contain a recursive reference
     * to itself, either directly or indirectly.
     * Done somewhere else
     */

    xmlFree(name);
    *str = ptr;
    return(ent);
}